

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long> __thiscall
tsbp::LeftmostActiveOnly::FindNewBottomLeft(LeftmostActiveOnly *this,Packing2D *packing)

{
  reference pvVar1;
  int *piVar2;
  size_t in_RDX;
  tuple<unsigned_long,_unsigned_long> tVar3;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  size_t currentMinX;
  size_t deactivatedX;
  size_t xBarPlaced;
  size_t y;
  size_t overallMinX;
  size_t previousX;
  size_t minY;
  size_t minX;
  size_t local_28;
  size_t abcissaMaxX;
  Packing2D *packing_local;
  LeftmostActiveOnly *this_local;
  
  abcissaMaxX = in_RDX;
  packing_local = packing;
  this_local = this;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDX + 0x50),0);
  minX._4_4_ = (undefined4)*pvVar1;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(abcissaMaxX + 0x68),
                      0);
  minX._0_4_ = (undefined4)*pvVar1;
  piVar2 = CLI::std::max<int>((int *)((long)&minX + 4),(int *)&minX);
  y = (size_t)*piVar2;
  previousX = 0;
  overallMinX = y;
  minY = y;
  local_28 = y;
  for (xBarPlaced = 0;
      xBarPlaced < (ulong)(long)*(int *)((long)&packing[1].PlacedItems.m_num_bits + 4);
      xBarPlaced = xBarPlaced + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (abcissaMaxX + 0x50),xBarPlaced);
    deactivatedX = *pvVar1;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (abcissaMaxX + 0x68),xBarPlaced);
    currentMinX = *pvVar1;
    local_74 = (int)deactivatedX;
    local_78 = (int)currentMinX;
    piVar2 = CLI::std::max<int>(&local_74,&local_78);
    local_80 = *piVar2;
    local_70 = (ulong)local_80;
    local_7c = (int)y;
    piVar2 = CLI::std::min<int>(&local_7c,&local_80);
    y = (size_t)*piVar2;
    if (((local_70 < minY) && (deactivatedX < overallMinX)) && (currentMinX < overallMinX)) {
      minY = local_70;
      previousX = xBarPlaced;
    }
    overallMinX = deactivatedX;
  }
  *(size_t *)(abcissaMaxX + 8) = y;
  tVar3 = std::make_tuple<unsigned_long&,unsigned_long&>((unsigned_long *)this,&minY);
  tVar3.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_long,_unsigned_long>)
         tVar3.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
}

Assistant:

std::tuple<size_t, size_t> LeftmostActiveOnly::FindNewBottomLeft(Packing2D& packing)
{
    // TODO.Test: what if abcissaMaxX = container.Dx. Test with item.Dx = container.Dx, container.Dy > item.Dy and (0, item.Dy) deactivated.

    size_t abcissaMaxX = std::max<int>(packing.PlacedAreaVector[0], packing.DeactivatedAreaVector[0]);
    size_t minX = abcissaMaxX;
    size_t minY = 0;
    size_t previousX = minX;

    size_t overallMinX = abcissaMaxX;

    for (size_t y = 0; y < container.Dy; y++)
    {
        size_t xBarPlaced = packing.PlacedAreaVector[y];
        size_t deactivatedX = packing.DeactivatedAreaVector[y];

        size_t currentMinX = std::max<int>(xBarPlaced, deactivatedX);
        overallMinX = std::min<int>(overallMinX, currentMinX);

        if (currentMinX < minX
            && xBarPlaced < previousX
            && deactivatedX < previousX)
        {
            minX = currentMinX;
            minY = y;
        }

        previousX = xBarPlaced;
    }

    packing.MinX = overallMinX;

    return std::make_tuple(minX, minY);
}